

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> __thiscall Parser::parseStmt(Parser *this)

{
  TokenType TVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  long *plVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  undefined8 *puVar8;
  pointer pcVar9;
  Parser *in_RSI;
  undefined **ppuVar10;
  undefined1 local_d0 [8];
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_a8 [8];
  pointer puStack_a0;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> local_58;
  _Head_base<0UL,_AST::Stmt_*,_false> local_50;
  vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
  local_48;
  
  while (TVar1 = (in_RSI->m_currToken).type, TVar1 == EOL) {
    eatToken(in_RSI,EOL);
  }
  switch(TVar1) {
  case Def:
    local_50._M_head_impl = (Stmt *)this;
    eatToken(in_RSI,Def);
    local_d0 = *(undefined1 (*) [8])&in_RSI->m_currToken;
    local_c8 = local_c0._M_local_buf + 8;
    pcVar9 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar9,pcVar9 + (in_RSI->m_currToken).literal._M_string_length);
    eatToken(in_RSI,Identifier);
    eatToken(in_RSI,LeftParen);
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((in_RSI->m_currToken).type != RightParen) {
      do {
        local_a8 = *(undefined1 (*) [8])&in_RSI->m_currToken;
        pcVar9 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
        puStack_a0 = (pointer)(local_98 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&puStack_a0,pcVar9,
                   pcVar9 + (in_RSI->m_currToken).literal._M_string_length);
        eatToken(in_RSI,Identifier);
        if ((in_RSI->m_currToken).type != RightParen) {
          eatToken(in_RSI,Comma);
        }
        plVar5 = (long *)operator_new(0x28);
        local_78._M_p = (pointer)&local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,puStack_a0,
                   (pointer)((long)&(puStack_a0->_M_t).
                                    super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>
                                    .super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl +
                            local_98._0_8_));
        *plVar5 = (long)&PTR__Identifier_001817b0;
        plVar5[1] = (long)(plVar5 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar5 + 1),local_78._M_p,local_70._M_p + local_78._M_p);
        local_58._M_t.super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>.
        _M_t.super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
        super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl =
             (__uniq_ptr_data<AST::Identifier,_std::default_delete<AST::Identifier>,_true,_true>)
             (__uniq_ptr_data<AST::Identifier,_std::default_delete<AST::Identifier>,_true,_true>)
             plVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        std::
        vector<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::allocator<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>>
        ::emplace_back<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>
                  ((vector<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::allocator<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>>
                    *)&local_48,&local_58);
        if (local_58._M_t.
            super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>._M_t.
            super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
            super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>)0x0) {
          (**(code **)(*(long *)local_58._M_t.
                                super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>
                                .super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl + 8))
                    ();
        }
        if (puStack_a0 != (pointer)(local_98 + 8)) {
          operator_delete(puStack_a0,local_98._8_8_ + 1);
        }
      } while ((in_RSI->m_currToken).type != RightParen);
    }
    eatToken(in_RSI,RightParen);
    parseBlockStmt((Parser *)&local_78);
    p_Var6 = (_func_int *)operator_new(0x28);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_c8,local_c8 + local_c0._M_allocated_capacity);
    this = (Parser *)local_50._M_head_impl;
    *(undefined ***)p_Var6 = &PTR__Identifier_001817b0;
    *(_func_int **)(p_Var6 + 8) = p_Var6 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var6 + 8),local_a8,(pointer)((long)local_a8 + (long)&puStack_a0->_M_t));
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._0_8_ + 1));
    }
    pp_Var7 = (_func_int **)operator_new(0x30);
    puVar4 = local_48.
             super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar3 = local_48.
             super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = local_48.
             super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *pp_Var7 = (_func_int *)&PTR__FnDecl_00181908;
    pp_Var7[1] = p_Var6;
    pp_Var7[2] = (_func_int *)puVar2;
    pp_Var7[3] = (_func_int *)puVar3;
    pp_Var7[4] = (_func_int *)puVar4;
    local_98._0_8_ = (pointer)0x0;
    local_a8 = (undefined1  [8])0x0;
    puStack_a0 = (pointer)0x0;
    pp_Var7[5] = (_func_int *)local_78._M_p;
    std::
    vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ::~vector((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
               *)local_a8);
    ((Stmt *)this)->_vptr_Stmt = pp_Var7;
    std::
    vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ::~vector(&local_48);
    if (local_c8 == local_c0._M_local_buf + 8) {
      return (unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>)this;
    }
    goto LAB_00132e5a;
  case Let:
    eatToken(in_RSI,Let);
    local_d0 = *(undefined1 (*) [8])&in_RSI->m_currToken;
    local_c8 = local_c0._M_local_buf + 8;
    pcVar9 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar9,pcVar9 + (in_RSI->m_currToken).literal._M_string_length);
    eatToken(in_RSI,Identifier);
    eatToken(in_RSI,Equal);
    parseOrExpr((Parser *)&local_78);
    puVar8 = (undefined8 *)operator_new(0x28);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_c8,local_c8 + local_c0._M_allocated_capacity);
    *puVar8 = &PTR__Identifier_001817b0;
    puVar8[1] = puVar8 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar8 + 1),local_a8,(pointer)((long)local_a8 + (long)&puStack_a0->_M_t));
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._0_8_ + 1));
    }
    pcVar9 = (pointer)operator_new(0x18);
    *(undefined ***)pcVar9 = &PTR__LetStmt_00181808;
    *(undefined8 **)(pcVar9 + 8) = puVar8;
    *(pointer *)(pcVar9 + 0x10) = local_78._M_p;
    goto LAB_00132e48;
  default:
    parseOrExpr((Parser *)local_d0);
    if ((in_RSI->m_currToken).type != Equal) {
      pcVar9 = (pointer)operator_new(0x10);
      ppuVar10 = &PTR__ExprStmt_001819c8;
      break;
    }
    eatToken(in_RSI,Equal);
    parseOrExpr((Parser *)local_a8);
    pcVar9 = (pointer)operator_new(0x18);
    ppuVar10 = &PTR__AssignStmt_00181988;
    goto LAB_00132eee;
  case If:
  case Elif:
    eatToken(in_RSI,TVar1);
    parseOrExpr((Parser *)local_d0);
    parseBlockStmt((Parser *)local_a8);
    TVar1 = (in_RSI->m_currToken).type;
    if (TVar1 == Else) {
      eatToken(in_RSI,Else);
      parseBlockStmt((Parser *)&local_78);
      pcVar9 = (pointer)operator_new(0x20);
    }
    else {
      if (TVar1 != Elif) {
        pcVar9 = (pointer)operator_new(0x20);
        *(undefined ***)pcVar9 = &PTR__IfStmt_001816a0;
        *(undefined1 (*) [8])(pcVar9 + 8) = local_d0;
        *(undefined1 (*) [8])(pcVar9 + 0x10) = local_a8;
        pcVar9[0x18] = '\0';
        pcVar9[0x19] = '\0';
        pcVar9[0x1a] = '\0';
        pcVar9[0x1b] = '\0';
        pcVar9[0x1c] = '\0';
        pcVar9[0x1d] = '\0';
        pcVar9[0x1e] = '\0';
        pcVar9[0x1f] = '\0';
        goto LAB_00132f96;
      }
      parseStmt((Parser *)&local_78);
      pcVar9 = (pointer)operator_new(0x20);
    }
    *(undefined ***)pcVar9 = &PTR__IfStmt_001816a0;
    *(undefined1 (*) [8])(pcVar9 + 8) = local_d0;
    *(undefined1 (*) [8])(pcVar9 + 0x10) = local_a8;
    *(pointer *)(pcVar9 + 0x18) = local_78._M_p;
    goto LAB_00132f96;
  case While:
    eatToken(in_RSI,While);
    parseOrExpr((Parser *)local_d0);
    parseBlockStmt((Parser *)local_a8);
    pcVar9 = (pointer)operator_new(0x18);
    ppuVar10 = &PTR__WhileStmt_001816f0;
LAB_00132eee:
    *(undefined ***)pcVar9 = ppuVar10;
    *(undefined1 (*) [8])(pcVar9 + 8) = local_d0;
    *(undefined1 (*) [8])(pcVar9 + 0x10) = local_a8;
    goto LAB_00132f96;
  case Return:
    eatToken(in_RSI,Return);
    parseOrExpr((Parser *)local_d0);
    pcVar9 = (pointer)operator_new(0x10);
    ppuVar10 = &PTR__ReturnStmt_00181948;
    break;
  case Next:
    eatToken(in_RSI,Next);
    pcVar9 = (pointer)operator_new(8);
    ppuVar10 = &PTR__Stmt_00181730;
    goto LAB_00132d79;
  case Break:
    eatToken(in_RSI,Break);
    pcVar9 = (pointer)operator_new(8);
    ppuVar10 = &PTR__Stmt_00181770;
LAB_00132d79:
    *(undefined ***)pcVar9 = ppuVar10;
    goto LAB_00132f96;
  case Print:
    eatToken(in_RSI,Print);
    parseOrExpr((Parser *)local_d0);
    pcVar9 = (pointer)operator_new(0x10);
    ppuVar10 = &PTR__PrintStmt_00181848;
    break;
  case Scan:
    eatToken(in_RSI,Scan);
    local_d0 = *(undefined1 (*) [8])&in_RSI->m_currToken;
    local_c8 = local_c0._M_local_buf + 8;
    pcVar9 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar9,pcVar9 + (in_RSI->m_currToken).literal._M_string_length);
    eatToken(in_RSI,Identifier);
    puVar8 = (undefined8 *)operator_new(0x28);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_c8,local_c8 + local_c0._M_allocated_capacity);
    *puVar8 = &PTR__Identifier_001817b0;
    puVar8[1] = puVar8 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar8 + 1),local_a8,(pointer)((long)local_a8 + (long)&puStack_a0->_M_t));
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._0_8_ + 1));
    }
    pcVar9 = (pointer)operator_new(0x10);
    *(undefined ***)pcVar9 = &PTR__ScanStmt_001818c8;
    *(undefined8 **)(pcVar9 + 8) = puVar8;
LAB_00132e48:
    (this->m_lexer).m_input._M_dataplus._M_p = pcVar9;
    if (local_c8 == local_c0._M_local_buf + 8) {
      return (unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>)this;
    }
LAB_00132e5a:
    operator_delete(local_c8,local_c0._8_8_ + 1);
    return (unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>)this;
  case Err:
    eatToken(in_RSI,Err);
    parseOrExpr((Parser *)local_d0);
    pcVar9 = (pointer)operator_new(0x10);
    ppuVar10 = &PTR__ErrStmt_00181888;
    break;
  case END:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)0x0;
    return (unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>)this;
  }
  *(undefined ***)pcVar9 = ppuVar10;
  *(undefined1 (*) [8])(pcVar9 + 8) = local_d0;
LAB_00132f96:
  (this->m_lexer).m_input._M_dataplus._M_p = pcVar9;
  return (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)
         (tuple<AST::Stmt_*,_std::default_delete<AST::Stmt>_>)this;
}

Assistant:

std::unique_ptr<AST::Stmt> Parser::parseStmt() {
    if (m_currToken.type == TokenType::END) {
        return nullptr;
    }
    if (m_currToken.type == TokenType::EOL) {
        eatToken(TokenType::EOL);
        return parseStmt();
    }
    if (m_currToken.type == TokenType::If || m_currToken.type == TokenType::Elif) {
        eatToken(m_currToken.type);
        auto cond = parseExpr();
        auto body = parseBlockStmt();

        if (m_currToken.type == TokenType::Elif) {
            auto falseBody = parseStmt();
            return std::make_unique<AST::IfStmt>(std::move(cond),
                                                 std::move(body),
                                                 std::move(falseBody));
        } else if (m_currToken.type == TokenType::Else) {
            eatToken(TokenType::Else);
            auto falseBody = parseBlockStmt();
            return std::make_unique<AST::IfStmt>(std::move(cond),
                                                 std::move(body),
                                                 std::move(falseBody));
        }

        return std::make_unique<AST::IfStmt>(std::move(cond), std::move(body), nullptr);
    }

    if (m_currToken.type == TokenType::While) {
        eatToken(TokenType::While);
        auto cond = parseExpr();
        auto body = parseBlockStmt();

        return std::make_unique<AST::WhileStmt>(std::move(cond), std::move(body));
    }

    if (m_currToken.type == TokenType::Next) {
        eatToken(TokenType::Next);
        return std::make_unique<AST::NextStmt>();
    }

    if (m_currToken.type == TokenType::Break) {
        eatToken(TokenType::Break);
        return std::make_unique<AST::BreakStmt>();
    }

    if (m_currToken.type == TokenType::Let) {
        eatToken(TokenType::Let);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        eatToken(TokenType::Equal);
        auto val = parseExpr();
        return std::make_unique<AST::LetStmt>(std::make_unique<AST::Identifier>(id.literal), std::move(val));
    }

    if (m_currToken.type == TokenType::Print) {
        eatToken(TokenType::Print);
        auto expr = parseExpr();
        return std::make_unique<AST::PrintStmt>(std::move(expr));
    }

    if (m_currToken.type == TokenType::Err) {
        eatToken(TokenType::Err);
        auto expr = parseExpr();
        return std::make_unique<AST::ErrStmt>(std::move(expr));
    }

    if (m_currToken.type == TokenType::Scan) {
        eatToken(TokenType::Scan);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        return std::make_unique<AST::ScanStmt>(std::make_unique<AST::Identifier>(id.literal));
    }

    if (m_currToken.type == TokenType::Def) {
        eatToken(TokenType::Def);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        eatToken(TokenType::LeftParen);
        std::vector<std::unique_ptr<AST::Identifier>> params;
        while (m_currToken.type != TokenType::RightParen) {
            Token param = m_currToken;
            eatToken(TokenType::Identifier);
            if (m_currToken.type != TokenType::RightParen) {
                eatToken(TokenType::Comma);
            }
            params.push_back(std::make_unique<AST::Identifier>(param.literal));
        }
        eatToken(TokenType::RightParen);
        auto body = parseBlockStmt();
        return std::make_unique<AST::FnDecl>(std::make_unique<AST::Identifier>(id.literal),
                                             std::move(params),
                                             std::move(body));
    }

    if (m_currToken.type == TokenType::Return) {
        eatToken(TokenType::Return);
        std::unique_ptr<AST::Expr> expr = parseExpr();
        return std::make_unique<AST::ReturnStmt>(std::move(expr));
    }

    // assignment or expr statement
    std::unique_ptr<AST::Expr> expr = parseExpr();
    if (m_currToken.type == TokenType::Equal) {
        eatToken(TokenType::Equal);
        auto rval = parseExpr();
        // TODO: add checks that lval is valid.
        return std::make_unique<AST::AssignStmt>(std::move(expr), std::move(rval));
    } else {
        return std::make_unique<AST::ExprStmt>(std::move(expr));
    }
}